

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddFile
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          FileDescriptorProto *file,FileDescriptorProto *value)

{
  pointer pcVar1;
  bool bVar2;
  LogMessage *pLVar3;
  long lVar4;
  string path;
  LogFinisher local_91;
  FileDescriptorProto *local_90;
  undefined1 local_88 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90 = value;
  bVar2 = InsertIfNotPresent<std::map<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>,std::__cxx11::string,google::protobuf::FileDescriptorProto_const*>
                    (&this->by_name_,file->name_,&local_90);
  if (!bVar2) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_88,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor_database.cc"
               ,0x39);
    pLVar3 = internal::LogMessage::operator<<
                       ((LogMessage *)local_88,"File already exists in database: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,file->name_);
    internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar3);
    internal::LogMessage::~LogMessage((LogMessage *)local_88);
    return false;
  }
  if ((file->_has_bits_[0] & 2) == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar1 = (file->package_->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + file->package_->_M_string_length);
    if (local_50._M_string_length != 0) {
      std::__cxx11::string::push_back((char)&local_50);
    }
  }
  if (0 < (file->message_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     &local_50,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      ((long)(file->message_type_).super_RepeatedPtrFieldBase.elements_[lVar4] +
                      0x10));
      bVar2 = AddSymbol(this,(string *)local_88,local_90);
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
      if (!bVar2) goto LAB_001f5d15;
      if ((file->message_type_).super_RepeatedPtrFieldBase.current_size_ <= lVar4) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<
                           ((LogMessage *)local_88,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_91,pLVar3);
        internal::LogMessage::~LogMessage((LogMessage *)local_88);
      }
      bVar2 = AddNestedExtensions(this,(DescriptorProto *)
                                       (file->message_type_).super_RepeatedPtrFieldBase.elements_
                                       [lVar4],local_90);
      if (!bVar2) goto LAB_001f5d15;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (file->message_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (file->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     &local_50,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      ((long)(file->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar4] + 0x10))
      ;
      bVar2 = AddSymbol(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_88,local_90);
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
      if (!bVar2) goto LAB_001f5d15;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (file->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (file->extension_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     &local_50,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      ((long)(file->extension_).super_RepeatedPtrFieldBase.elements_[lVar4] + 0x10))
      ;
      bVar2 = AddSymbol(this,(string *)local_88,local_90);
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
      if (!bVar2) goto LAB_001f5d15;
      if ((file->extension_).super_RepeatedPtrFieldBase.current_size_ <= lVar4) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<
                           ((LogMessage *)local_88,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_91,pLVar3);
        internal::LogMessage::~LogMessage((LogMessage *)local_88);
      }
      bVar2 = AddExtension(this,(FieldDescriptorProto *)
                                (file->extension_).super_RepeatedPtrFieldBase.elements_[lVar4],
                           local_90);
      if (!bVar2) goto LAB_001f5d15;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (file->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((file->service_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    bVar2 = true;
  }
  else {
    lVar4 = 0;
    do {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     &local_50,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      ((long)(file->service_).super_RepeatedPtrFieldBase.elements_[lVar4] + 0x10));
      bVar2 = AddSymbol(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_88,local_90);
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
    } while ((bVar2) &&
            (lVar4 = lVar4 + 1, lVar4 < (file->service_).super_RepeatedPtrFieldBase.current_size_));
  }
LAB_001f5d17:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
LAB_001f5d15:
  bVar2 = false;
  goto LAB_001f5d17;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddFile(
    const FileDescriptorProto& file,
    Value value) {
  if (!InsertIfNotPresent(&by_name_, file.name(), value)) {
    GOOGLE_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  // We must be careful here -- calling file.package() if file.has_package() is
  // false could access an uninitialized static-storage variable if we are being
  // run at startup time.
  string path = file.has_package() ? file.package() : string();
  if (!path.empty()) path += '.';

  for (int i = 0; i < file.message_type_size(); i++) {
    if (!AddSymbol(path + file.message_type(i).name(), value)) return false;
    if (!AddNestedExtensions(file.message_type(i), value)) return false;
  }
  for (int i = 0; i < file.enum_type_size(); i++) {
    if (!AddSymbol(path + file.enum_type(i).name(), value)) return false;
  }
  for (int i = 0; i < file.extension_size(); i++) {
    if (!AddSymbol(path + file.extension(i).name(), value)) return false;
    if (!AddExtension(file.extension(i), value)) return false;
  }
  for (int i = 0; i < file.service_size(); i++) {
    if (!AddSymbol(path + file.service(i).name(), value)) return false;
  }

  return true;
}